

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_flush_ex(LIBSSH2_CHANNEL *channel,int stream)

{
  int iVar1;
  time_t start_time;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      iVar1 = _libssh2_channel_flush(channel,stream);
      if (iVar1 != -0x25) {
        return iVar1;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_flush_ex(LIBSSH2_CHANNEL *channel, int stream)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_flush(channel, stream));
    return rc;
}